

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void * saferealloc(void *ptr,size_t n,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  if (n <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0)) {
    if (ptr == (void *)0x0) {
      pvVar2 = malloc(size * n);
    }
    else {
      pvVar2 = realloc(ptr,size * n);
    }
    if (pvVar2 != (void *)0x0) {
      return pvVar2;
    }
  }
  out_of_memory();
}

Assistant:

void *saferealloc(void *ptr, size_t n, size_t size)
{
    void *p;

    if (n > INT_MAX / size) {
        p = NULL;
    } else {
        size *= n;
        if (!ptr) {
#ifdef MINEFIELD
            p = minefield_c_malloc(size);
#else
            p = malloc(size);
#endif
        } else {
#ifdef MINEFIELD
            p = minefield_c_realloc(ptr, size);
#else
            p = realloc(ptr, size);
#endif
        }
    }

    if (!p)
        out_of_memory();

    return p;
}